

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O1

RationalNum __thiscall RationalNum::operator-(RationalNum *this)

{
  RationalNum RVar1;
  RationalNum temp;
  RationalNum local_18;
  
  local_18.denominator = 1;
  local_18.numerator = (longlong)-(int)this->numerator;
  setDenominator(&local_18,(long)(int)this->denominator);
  RVar1.denominator = local_18.denominator;
  RVar1.numerator = local_18.numerator;
  return RVar1;
}

Assistant:

RationalNum RationalNum::operator-() const {
    RationalNum temp;
    temp.setNumerator(-getNumerator());
    temp.setDenominator(getDenominator());
    return temp;
}